

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.cpp
# Opt level: O2

LinkIndex __thiscall iDynTree::Model::getFrameLink(Model *this,FrameIndex frameIndex)

{
  long lVar1;
  size_t sVar2;
  ostream *poVar3;
  LinkIndex LVar4;
  char *local_1c0 [4];
  stringstream ss;
  ostream local_190 [376];
  
  if (frameIndex < 0) {
    lVar1 = ((long)(this->links).super__Vector_base<iDynTree::Link,_std::allocator<iDynTree::Link>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->links).super__Vector_base<iDynTree::Link,_std::allocator<iDynTree::Link>_>.
                  _M_impl.super__Vector_impl_data._M_start) / 0x70;
  }
  else {
    lVar1 = ((long)(this->links).super__Vector_base<iDynTree::Link,_std::allocator<iDynTree::Link>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->links).super__Vector_base<iDynTree::Link,_std::allocator<iDynTree::Link>_>.
                  _M_impl.super__Vector_impl_data._M_start) / 0x70;
    if (frameIndex < lVar1) {
      return frameIndex;
    }
  }
  if ((frameIndex < lVar1) || (sVar2 = getNrOfFrames(this), (long)sVar2 <= frameIndex)) {
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    poVar3 = std::operator<<(local_190,"frameIndex ");
    poVar3 = std::ostream::_M_insert<long>((long)poVar3);
    poVar3 = std::operator<<(poVar3," is not valid, should be between 0 and ");
    getNrOfFrames(this);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::__cxx11::stringbuf::str();
    iDynTree::reportError("Model","getFrameLink",local_1c0[0]);
    std::__cxx11::string::~string((string *)local_1c0);
    LVar4 = LINK_INVALID_INDEX;
    std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  }
  else {
    LVar4 = (this->additionalFramesLinks).super__Vector_base<long,_std::allocator<long>_>._M_impl.
            super__Vector_impl_data._M_start[frameIndex - lVar1];
  }
  return LVar4;
}

Assistant:

LinkIndex Model::getFrameLink(const FrameIndex frameIndex) const
{
    // The link_H_frame transform for the link
    // main frame is the link it self
    if( frameIndex >= 0 &&
        frameIndex < (FrameIndex) this->getNrOfLinks() )
    {
        return (LinkIndex)frameIndex;
    }

    if( frameIndex >= (FrameIndex) this->getNrOfLinks() &&
        frameIndex < (FrameIndex) this->getNrOfFrames() )
    {
        // For an additonal frame the link index is instead stored
        // in the additionalFramesLinks vector
        return this->additionalFramesLinks[frameIndex-getNrOfLinks()];
    }

    // If the frameIndex is out of bounds, return an invalid index
    std::stringstream ss;
    ss << "frameIndex " << frameIndex << " is not valid, should be between 0 and " << this->getNrOfFrames()-1;
    reportError("Model","getFrameLink",ss.str().c_str());
    return LINK_INVALID_INDEX;
}